

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglTestCase.cpp
# Opt level: O0

void __thiscall
deqp::egl::EglTestContext::EglTestContext
          (EglTestContext *this,TestContext *testCtx,NativeDisplayFactory *displayFactory)

{
  int iVar1;
  Platform *pPVar2;
  undefined4 extraout_var;
  CommandLine *cmdLine;
  DefaultDeleter<eglu::NativeDisplay> local_21;
  NativeDisplayFactory *local_20;
  NativeDisplayFactory *displayFactory_local;
  TestContext *testCtx_local;
  EglTestContext *this_local;
  
  this->m_testCtx = testCtx;
  this->m_nativeDisplayFactory = displayFactory;
  local_20 = displayFactory;
  displayFactory_local = (NativeDisplayFactory *)testCtx;
  testCtx_local = (TestContext *)this;
  iVar1 = (*(this->m_nativeDisplayFactory->super_FactoryBase).super_AbstractFactory.
            _vptr_AbstractFactory[3])(this->m_nativeDisplayFactory,0);
  de::DefaultDeleter<eglu::NativeDisplay>::DefaultDeleter(&local_21);
  de::details::UniquePtr<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>::UniquePtr
            (&this->m_nativeDisplay,iVar1);
  pPVar2 = tcu::TestContext::getPlatform((TestContext *)displayFactory_local);
  iVar1 = (*pPVar2->_vptr_Platform[4])();
  cmdLine = tcu::TestContext::getCommandLine((TestContext *)displayFactory_local);
  eglu::GLLibraryCache::GLLibraryCache
            (&this->m_glLibraryCache,(Platform *)CONCAT44(extraout_var,iVar1),cmdLine);
  return;
}

Assistant:

EglTestContext::EglTestContext (tcu::TestContext& testCtx, const eglu::NativeDisplayFactory& displayFactory)
	: m_testCtx					(testCtx)
	, m_nativeDisplayFactory	(displayFactory)
	, m_nativeDisplay			(m_nativeDisplayFactory.createDisplay())
	, m_glLibraryCache			(testCtx.getPlatform().getEGLPlatform(), testCtx.getCommandLine())
{
}